

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmLocalGenerator *this_01;
  bool bVar1;
  InstalledFilesMap *this_02;
  reference ppcVar2;
  cmMakefile *this_03;
  char *pcVar3;
  pointer ppVar4;
  undefined1 local_380 [8];
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmInstalledFile *installedFile;
  _Self local_2f0;
  const_iterator i;
  cmGeneratedFileStream file;
  string local_98 [8];
  string path;
  undefined1 local_68 [8];
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  InstalledFilesMap *installedFiles;
  cmGlobalGenerator *this_local;
  
  this_02 = cmake::GetInstalledFiles_abi_cxx11_(this->CMakeInstance);
  ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&this->LocalGenerators,0);
  this_01 = *ppcVar2;
  this_03 = cmLocalGenerator::GetMakefile(this_01);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmMakefile::GetConfigurations((string *)local_68,this_03,this_00,false);
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar3,(allocator *)&file.field_0x247);
  std::allocator<char>::~allocator((allocator<char> *)&file.field_0x247);
  std::__cxx11::string::operator+=(local_98,"/CPackProperties.cmake");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar3);
  if ((bVar1) ||
     (bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
              ::empty(this_02), !bVar1)) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&i,pcVar3,false,None);
    std::operator<<((ostream *)&i,"# CPack properties\n");
    local_2f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
         ::begin(this_02);
    while( true ) {
      installedFile =
           (cmInstalledFile *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
           ::end(this_02);
      bVar1 = std::operator!=(&local_2f0,(_Self *)&installedFile);
      if (!bVar1) break;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
               ::operator->(&local_2f0);
      cpackPropertiesGenerator.InstalledFile = &ppVar4->second;
      cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                ((cmCPackPropertiesGenerator *)local_380,this_01,
                 cpackPropertiesGenerator.InstalledFile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      cmScriptGenerator::Generate
                ((cmScriptGenerator *)local_380,(ostream *)&i,(string *)local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      cmCPackPropertiesGenerator::~cmCPackPropertiesGenerator
                ((cmCPackPropertiesGenerator *)local_380);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
      ::operator++(&local_2f0);
    }
    file._576_4_ = 1;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&i);
  }
  else {
    file._576_4_ = 1;
  }
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  cmLocalGenerator* lg = this->LocalGenerators[0];
  cmMakefile* mf = lg->GetMakefile();

  std::vector<std::string> configs;
  std::string config = mf->GetConfigurations(configs, false);

  std::string path = this->CMakeInstance->GetHomeOutputDirectory();
  path += "/CPackProperties.cmake";

  if (!cmSystemTools::FileExists(path.c_str()) && installedFiles.empty()) {
    return true;
  }

  cmGeneratedFileStream file(path.c_str());
  file << "# CPack properties\n";

  for (cmake::InstalledFilesMap::const_iterator i = installedFiles.begin();
       i != installedFiles.end(); ++i) {
    cmInstalledFile const& installedFile = i->second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(lg, installedFile,
                                                        configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
  }

  return true;
}